

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbjava.cpp
# Opt level: O3

void __thiscall
DynLibrary::findSymbol<int(*)(JavaVM_**,void**,void*)>
          (DynLibrary *this,char *name,_func_int_JavaVM__ptr_ptr_void_ptr_ptr_void_ptr **ptr)

{
  _func_int_JavaVM__ptr_ptr_void_ptr_ptr_void_ptr *p_Var1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var1 = (_func_int_JavaVM__ptr_ptr_void_ptr_ptr_void_ptr *)dlsym(this->module);
  *ptr = p_Var1;
  if (p_Var1 != (_func_int_JavaVM__ptr_ptr_void_ptr_ptr_void_ptr *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Symbol \'","");
  plVar2 = (long *)std::__cxx11::string::append((string *)local_b0,name);
  local_90 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_90 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((string *)&local_90,"\' not found in \'");
  local_70._M_dataplus._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar4) {
    local_70.field_2._M_allocated_capacity = *psVar4;
    local_70.field_2._8_8_ = plVar2[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar4;
  }
  local_70._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::operator+(&local_50,&local_70,&this->filename);
  plVar2 = (long *)std::__cxx11::string::append((string *)&local_50,"\'.");
  local_d0 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_d0 == plVar3) {
    local_c0 = *plVar3;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar3;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_d0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void findSymbol(const char* name, T& ptr)
	{
#ifdef WIN32
		ptr = reinterpret_cast<T>(GetProcAddress(module, name));
#else
		ptr = reinterpret_cast<T>(dlsym(module, name));
#endif

		if (!ptr)
			throw runtime_error(string("Symbol '") + name + "' not found in '" + filename + "'.");
	}